

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O0

DelimitedSection *
soul::HTMLGenerator::findDelimitedSection
          (DelimitedSection *__return_storage_ptr__,string_view text,string_view delimiter)

{
  string_view delimiter_00;
  string_view text_00;
  char *pcVar1;
  char cVar2;
  CharType CVar3;
  CharType CVar4;
  CharType CVar5;
  CharType CVar6;
  size_t sVar7;
  size_type sVar8;
  size_t sVar9;
  size_t index;
  char *pcVar10;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  CharType postEnd;
  CharType preEnd;
  CharType postStart;
  CharType preStart;
  size_t end;
  size_t start;
  string_view delimiter_local;
  string_view text_local;
  
  delimiter_local._M_len = (size_t)delimiter._M_str;
  start = delimiter._M_len;
  pcVar10 = text._M_str;
  delimiter_local._M_str = (char *)text._M_len;
  sVar7 = findDelimiter(text,delimiter,0);
  pcVar1 = delimiter_local._M_str;
  index = delimiter_local._M_len;
  sVar9 = start;
  if (sVar7 != 0xffffffffffffffff) {
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&start);
    text_00._M_str = pcVar10;
    text_00._M_len = (size_t)pcVar1;
    delimiter_00._M_str = (char *)index;
    delimiter_00._M_len = sVar9;
    sVar9 = findDelimiter(text_00,delimiter_00,sVar7 + sVar8);
    if (sVar9 != 0xffffffffffffffff) {
      text_01._M_str = (char *)(sVar7 - 1);
      text_01._M_len = (size_t)pcVar10;
      cVar2 = getChar((HTMLGenerator *)delimiter_local._M_str,text_01,index);
      CVar3 = getCharType(cVar2);
      pcVar1 = delimiter_local._M_str;
      sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&start);
      text_02._M_str = (char *)(sVar7 + sVar8);
      text_02._M_len = (size_t)pcVar10;
      cVar2 = getChar((HTMLGenerator *)pcVar1,text_02,index);
      CVar4 = getCharType(cVar2);
      text_03._M_str = (char *)(sVar9 - 1);
      text_03._M_len = (size_t)pcVar10;
      cVar2 = getChar((HTMLGenerator *)delimiter_local._M_str,text_03,index);
      CVar5 = getCharType(cVar2);
      pcVar1 = delimiter_local._M_str;
      sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&start);
      text_04._M_str = (char *)(sVar9 + sVar8);
      text_04._M_len = (size_t)pcVar10;
      cVar2 = getChar((HTMLGenerator *)pcVar1,text_04,index);
      CVar6 = getCharType(cVar2);
      if ((((CVar3 != text) && (CVar6 != text)) && (CVar4 != whitespace)) && (CVar5 != whitespace))
      {
        __return_storage_ptr__->outerStart = sVar7;
        sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&start);
        __return_storage_ptr__->outerEnd = sVar9 + sVar8;
        sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&start);
        __return_storage_ptr__->delimiterLength = sVar8;
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->outerStart = 0;
  __return_storage_ptr__->outerEnd = 0;
  __return_storage_ptr__->delimiterLength = 0;
  return __return_storage_ptr__;
}

Assistant:

static DelimitedSection findDelimitedSection (std::string_view text, std::string_view delimiter)
    {
        auto start = findDelimiter (text, delimiter, 0);

        if (start != std::string_view::npos)
        {
            auto end = findDelimiter (text, delimiter, start + delimiter.length());

            if (end != std::string_view::npos)
            {
                auto preStart  = getCharType (getChar (text, start - 1));
                auto postStart = getCharType (getChar (text, start + delimiter.length()));

                auto preEnd  = getCharType (getChar (text, end - 1));
                auto postEnd = getCharType (getChar (text, end + delimiter.length()));

                if (preStart != CharType::text
                     && postEnd != CharType::text
                     && postStart != CharType::whitespace
                     && preEnd != CharType::whitespace)
                    return { start, end + delimiter.length(), delimiter.length() };
            }
        }

        return {};
    }